

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::anon_unknown_3::CompileShaderInternal
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TShader *Shader,EShMessages messages,Includer *pIncluder,char *ShaderSource,
          size_t SourceCodeLen,bool AssignBindings,EProfile shProfile,IDataBlob **ppCompilerOutput)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *__to;
  TBuiltInResource Resources;
  TProgram Program;
  
  iVar2 = 1;
  glslang::TShader::setAutoMapBindings(Shader,true);
  glslang::TShader::setAutoMapLocations(Shader,true);
  Resources.maxLights = 0x20;
  Resources.maxClipPlanes = 6;
  Resources.maxTextureUnits = 0x20;
  Resources.maxTextureCoords = 0x20;
  Resources.maxVertexAttribs = 0x40;
  Resources.maxVertexUniformComponents = 0x1000;
  Resources.maxVaryingFloats = 0x40;
  Resources.maxVertexTextureImageUnits = 0x20;
  Resources.maxCombinedTextureImageUnits = 0x50;
  Resources.maxTextureImageUnits = 0x20;
  Resources.maxFragmentUniformComponents = 0x1000;
  Resources.maxDrawBuffers = 0x20;
  Resources.maxVertexUniformVectors = 0x80;
  Resources.maxVaryingVectors = 8;
  Resources.maxFragmentUniformVectors = 0x10;
  Resources.maxVertexOutputVectors = 0x10;
  Resources.maxFragmentInputVectors = 0xf;
  Resources.minProgramTexelOffset = -8;
  Resources.maxProgramTexelOffset = 7;
  Resources.maxClipDistances = 8;
  Resources.maxComputeWorkGroupCountX = 0xffff;
  Resources.maxComputeWorkGroupCountY = 0xffff;
  Resources.maxComputeWorkGroupCountZ = 0xffff;
  Resources.maxComputeWorkGroupSizeX = 0x400;
  Resources.maxComputeWorkGroupSizeY = 0x400;
  Resources.maxComputeWorkGroupSizeZ = 0x40;
  Resources.maxComputeUniformComponents = 0x400;
  Resources.maxComputeTextureImageUnits = 0x10;
  Resources.maxComputeImageUniforms = 8;
  Resources.maxComputeAtomicCounters = 8;
  Resources.maxComputeAtomicCounterBuffers = 1;
  Resources.maxVaryingComponents = 0x3c;
  Resources.maxVertexOutputComponents = 0x40;
  Resources.maxGeometryInputComponents = 0x40;
  Resources.maxGeometryOutputComponents = 0x80;
  Resources.maxFragmentInputComponents = 0x80;
  Resources.maxImageUnits = 8;
  Resources.maxCombinedImageUnitsAndFragmentOutputs = 8;
  Resources.maxCombinedShaderOutputResources = 8;
  Resources.maxImageSamples = 0;
  Resources.maxVertexImageUniforms = 0;
  Resources.maxTessControlImageUniforms = 0;
  Resources.maxTessEvaluationImageUniforms = 0;
  Resources.maxGeometryImageUniforms = 0;
  Resources.maxFragmentImageUniforms = 8;
  Resources.maxCombinedImageUniforms = 8;
  Resources.maxGeometryTextureImageUnits = 0x10;
  Resources.maxGeometryOutputVertices = 0x100;
  Resources.maxGeometryTotalOutputComponents = 0x400;
  Resources.maxGeometryUniformComponents = 0x400;
  Resources.maxGeometryVaryingComponents = 0x40;
  Resources.maxTessControlInputComponents = 0x80;
  Resources.maxTessControlOutputComponents = 0x80;
  Resources.maxTessControlTextureImageUnits = 0x10;
  Resources.maxTessControlUniformComponents = 0x400;
  Resources.maxTessControlTotalOutputComponents = 0x1000;
  Resources.maxTessEvaluationInputComponents = 0x80;
  Resources.maxTessEvaluationOutputComponents = 0x80;
  Resources.maxTessEvaluationTextureImageUnits = 0x10;
  Resources.maxTessEvaluationUniformComponents = 0x400;
  Resources.maxTessPatchComponents = 0x78;
  Resources.maxPatchVertices = 0x20;
  Resources.maxTessGenLevel = 0x40;
  Resources.maxViewports = 0x10;
  Resources.maxVertexAtomicCounters = 0;
  Resources.maxTessControlAtomicCounters = 0;
  Resources.maxTessEvaluationAtomicCounters = 0;
  Resources.maxGeometryAtomicCounters = 0;
  Resources.maxFragmentAtomicCounters = 8;
  Resources.maxCombinedAtomicCounters = 8;
  Resources.maxVertexAtomicCounterBuffers = 0;
  Resources.maxTessControlAtomicCounterBuffers = 0;
  Resources.maxTessEvaluationAtomicCounterBuffers = 0;
  Resources.maxGeometryAtomicCounterBuffers = 0;
  Resources.maxFragmentAtomicCounterBuffers = 1;
  Resources.maxCombinedAtomicCounterBuffers = 1;
  Resources.maxAtomicCounterBufferSize = 0x4000;
  Resources.maxTransformFeedbackBuffers = 4;
  Resources.maxTransformFeedbackInterleavedComponents = 0x40;
  Resources.maxCullDistances = 8;
  Resources.maxCombinedClipAndCullDistances = 8;
  Resources.maxSamples = 4;
  Resources.maxMeshOutputVerticesNV = 0x100;
  Resources.maxMeshOutputPrimitivesNV = 0x200;
  Resources.maxMeshWorkGroupSizeX_NV = 0x20;
  Resources.maxMeshWorkGroupSizeY_NV = 1;
  Resources.maxMeshWorkGroupSizeZ_NV = 1;
  Resources.maxTaskWorkGroupSizeX_NV = 0x20;
  Resources.maxTaskWorkGroupSizeY_NV = 1;
  Resources.maxTaskWorkGroupSizeZ_NV = 1;
  Resources.maxMeshViewCountNV = 4;
  Resources.maxMeshOutputVerticesEXT = 0x100;
  Resources.maxMeshOutputPrimitivesEXT = 0x100;
  Resources.maxMeshWorkGroupSizeX_EXT = 0x80;
  Resources.maxMeshWorkGroupSizeY_EXT = 0x80;
  Resources.maxMeshWorkGroupSizeZ_EXT = 0x80;
  Resources.maxTaskWorkGroupSizeX_EXT = 0x80;
  Resources.maxTaskWorkGroupSizeY_EXT = 0x80;
  Resources.maxTaskWorkGroupSizeZ_EXT = 0x80;
  Resources.maxMeshViewCountEXT = 4;
  Resources.limits.nonInductiveForLoops = true;
  Resources.limits.whileLoops = true;
  Resources.limits.doWhileLoops = true;
  Resources.limits.generalUniformIndexing = true;
  Resources.limits.generalAttributeMatrixVectorIndexing = true;
  Resources.limits.generalVaryingIndexing = true;
  Resources.limits.generalSamplerIndexing = true;
  Resources.limits.generalVariableIndexing = true;
  Resources.limits.generalConstantMatrixVectorIndexing = true;
  Resources._417_3_ = 0;
  Resources.maxAtomicCounterBindings = iVar2;
  Resources.maxDualSourceDrawBuffersEXT = iVar2;
  if (pIncluder == (Includer *)0x0) {
    bVar1 = glslang::TShader::parse(Shader,&Resources,100,shProfile,false,false,messages);
  }
  else {
    bVar1 = glslang::TShader::parse(Shader,&Resources,100,shProfile,false,false,messages,pIncluder);
  }
  if (bVar1 == false) {
    pcVar3 = glslang::TShader::getInfoLog(Shader);
    pcVar4 = glslang::TShader::getInfoDebugLog(Shader);
    LogCompilerError("Failed to parse shader source: \n",pcVar3,pcVar4,ShaderSource,SourceCodeLen,
                     ppCompilerOutput);
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    glslang::TProgram::TProgram(&Program);
    glslang::TProgram::addShader(&Program,Shader);
    iVar2 = glslang::TProgram::link(&Program,(char *)(ulong)messages,__to);
    if ((char)iVar2 == '\0') {
      pcVar3 = glslang::TProgram::getInfoLog(&Program);
      pcVar4 = glslang::TProgram::getInfoDebugLog(&Program);
      LogCompilerError("Failed to link program: \n",pcVar3,pcVar4,ShaderSource,SourceCodeLen,
                       ppCompilerOutput);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      if (AssignBindings) {
        glslang::TProgram::mapIO(&Program,(TIoMapResolver *)0x0,(TIoMapper *)0x0);
      }
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      glslang::GlslangToSpv
                (Program.intermediate[Shader->stage],__return_storage_ptr__,(SpvOptions *)0x0);
    }
    glslang::TProgram::~TProgram(&Program);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> CompileShaderInternal(::glslang::TShader&           Shader,
                                                EShMessages                   messages,
                                                ::glslang::TShader::Includer* pIncluder,
                                                const char*                   ShaderSource,
                                                size_t                        SourceCodeLen,
                                                bool                          AssignBindings,
                                                ::EProfile                    shProfile,
                                                IDataBlob**                   ppCompilerOutput)
{
    Shader.setAutoMapBindings(true);
    Shader.setAutoMapLocations(true);
    TBuiltInResource Resources = InitResources();

    auto ParseResult = pIncluder != nullptr ?
        Shader.parse(&Resources, 100, shProfile, false, false, messages, *pIncluder) :
        Shader.parse(&Resources, 100, shProfile, false, false, messages);
    if (!ParseResult)
    {
        LogCompilerError("Failed to parse shader source: \n", Shader.getInfoLog(), Shader.getInfoDebugLog(), ShaderSource, SourceCodeLen, ppCompilerOutput);
        return {};
    }

    ::glslang::TProgram Program;
    Program.addShader(&Shader);
    if (!Program.link(messages))
    {
        LogCompilerError("Failed to link program: \n", Program.getInfoLog(), Program.getInfoDebugLog(), ShaderSource, SourceCodeLen, ppCompilerOutput);
        return {};
    }

    // This step is essential to set bindings and descriptor sets
    if (AssignBindings)
        Program.mapIO();

    std::vector<unsigned int> spirv;
    ::glslang::GlslangToSpv(*Program.getIntermediate(Shader.getStage()), spirv);

    return spirv;
}